

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::ScalarReplacementPass::ReplaceWholeDebugValue
          (ScalarReplacementPass *this,Instruction *dbg_value,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  pointer ppIVar1;
  pointer pOVar2;
  IRContext *pIVar3;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var4;
  PodType PVar5;
  array<signed_char,_4UL> aVar6;
  Instruction *pIVar7;
  mapped_type *ppBVar8;
  pointer ppIVar9;
  bool local_b1;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_b0;
  int local_a4;
  undefined1 local_a0 [16];
  PodType local_90 [2];
  undefined1 local_88 [8];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_78;
  Instruction *local_70;
  BasicBlock *local_68;
  pointer local_60;
  undefined1 local_58 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  
  local_70 = dbg_value;
  local_68 = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,dbg_value);
  ppIVar1 = (replacements->
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (replacements->
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (ppIVar1 == local_60) {
    local_b1 = true;
  }
  else {
    local_a4 = 0;
    do {
      ppIVar9 = ppIVar1 + 1;
      pIVar7 = *ppIVar1;
      local_b0._M_head_impl = Instruction::Clone(local_70,(this->super_MemPass).super_Pass.context_)
      ;
      PVar5.data._M_elems = (array<signed_char,_4UL>)Pass::TakeNextId((Pass *)this);
      local_b1 = PVar5.data._M_elems != (_Type)0x0;
      if (local_b1) {
        if ((local_b0._M_head_impl)->has_result_id_ == false) {
          __assert_fail("has_result_id_",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2c8,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
        }
        local_a0._0_8_ = &PTR__SmallVector_00b02ef8;
        local_88 = (undefined1  [8])local_90;
        local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_90[0].data._M_elems = PVar5.data._M_elems;
        local_a0._8_8_ = (_func_int **)0x1;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)
                   ((long)&((OperandData *)
                           (((((local_b0._M_head_impl)->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data._M_start)->words).buffer + -4))->
                           _vptr_SmallVector +
                   (ulong)((uint)(local_b0._M_head_impl)->has_type_id_ * 0x30)),
                   (SmallVector<unsigned_int,_2UL> *)local_a0);
        local_a0._0_8_ = &PTR__SmallVector_00b02ef8;
        if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_80,local_80._M_head_impl);
        }
        _Var4._M_head_impl = local_b0._M_head_impl;
        aVar6._M_elems[0] = '\0';
        aVar6._M_elems[1] = '\0';
        aVar6._M_elems[2] = '\0';
        aVar6._M_elems[3] = '\0';
        if (pIVar7->has_result_id_ == true) {
          aVar6._M_elems =
               (_Type)Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
        }
        local_a0._0_8_ = &PTR__SmallVector_00b02ef8;
        local_88 = (undefined1  [8])local_90;
        local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_90[0].data._M_elems = (array<signed_char,_4UL>)(array<signed_char,_4UL>)aVar6._M_elems
        ;
        local_a0._8_8_ = (_func_int **)0x1;
        pOVar2 = ((_Var4._M_head_impl)->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)((_Var4._M_head_impl)->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
                   -0x5555555555555555) < 6) {
          __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2b8,
                        "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                       );
        }
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  (&pOVar2[5].words,(SmallVector<unsigned_int,_2UL> *)local_a0);
        local_a0._0_8_ = &PTR__SmallVector_00b02ef8;
        if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_80,local_80._M_head_impl);
        }
        _Var4._M_head_impl = local_b0._M_head_impl;
        pIVar3 = (this->super_MemPass).super_Pass.context_;
        if ((pIVar3->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
          IRContext::BuildConstantManager(pIVar3);
        }
        local_58._16_4_ =
             analysis::ConstantManager::GetSIntConstId
                       ((pIVar3->constant_mgr_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
                        _M_head_impl,local_a4);
        local_58._0_8_ = &PTR__SmallVector_00b02ef8;
        local_58._24_8_ = local_58 + 0x10;
        local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_58._8_8_ = 1;
        local_a0._0_4_ = 1;
        local_a0._8_8_ = &PTR__SmallVector_00b02ef8;
        local_90[0].data._M_elems = (array<signed_char,_4UL>)0x0;
        local_90[1].data._M_elems = (array<signed_char,_4UL>)0x0;
        local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88;
        local_78._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)(local_a0 + 8),
                   (SmallVector<unsigned_int,_2UL> *)local_58);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>(&(_Var4._M_head_impl)->operands_,(Operand *)local_a0);
        local_a0._8_8_ = &PTR__SmallVector_00b02ef8;
        if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )local_78._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_78,local_78._M_head_impl);
        }
        local_78._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_58._0_8_ = &PTR__SmallVector_00b02ef8;
        if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_38,local_38._M_head_impl);
        }
        pIVar7 = Instruction::InsertBefore
                           (local_70,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                      *)&local_b0);
        pIVar3 = (this->super_MemPass).super_Pass.context_;
        if ((pIVar3->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar3);
        }
        analysis::DefUseManager::AnalyzeInstDefUse
                  ((pIVar3->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,pIVar7);
        pIVar3 = (this->super_MemPass).super_Pass.context_;
        local_a0._0_8_ = pIVar7;
        if ((pIVar3->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
          ppBVar8 = std::__detail::
                    _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&pIVar3->instr_to_block_,(key_type *)local_a0);
          *ppBVar8 = local_68;
        }
        local_a4 = local_a4 + 1;
      }
      if (local_b0._M_head_impl != (Instruction *)0x0) {
        (*((local_b0._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
          _vptr_IntrusiveNodeBase[1])();
      }
    } while ((PVar5.data._M_elems != (_Type)0x0) && (ppIVar1 = ppIVar9, ppIVar9 != local_60));
  }
  return local_b1;
}

Assistant:

bool ScalarReplacementPass::ReplaceWholeDebugValue(
    Instruction* dbg_value, const std::vector<Instruction*>& replacements) {
  int32_t idx = 0;
  BasicBlock* block = context()->get_instr_block(dbg_value);
  for (auto var : replacements) {
    // Clone the DebugValue.
    std::unique_ptr<Instruction> new_dbg_value(dbg_value->Clone(context()));
    uint32_t new_id = TakeNextId();
    if (new_id == 0) return false;
    new_dbg_value->SetResultId(new_id);
    // Update 'Value' operand to the |replacements|.
    new_dbg_value->SetOperand(kDebugValueOperandValueIndex, {var->result_id()});
    // Append 'Indexes' operand.
    new_dbg_value->AddOperand(
        {SPV_OPERAND_TYPE_ID,
         {context()->get_constant_mgr()->GetSIntConstId(idx)}});
    // Insert the new DebugValue to the basic block.
    auto* added_instr = dbg_value->InsertBefore(std::move(new_dbg_value));
    get_def_use_mgr()->AnalyzeInstDefUse(added_instr);
    context()->set_instr_block(added_instr, block);
    ++idx;
  }
  return true;
}